

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2d0ac2::CFLSubAvgTest_DISABLED_SubAvgSpeedTest_Test::TestBody
          (CFLSubAvgTest_DISABLED_SubAvgSpeedTest_Test *this)

{
  int64_t iVar1;
  int64_t iVar2;
  int iVar3;
  bool bVar4;
  aom_usec_timer timer;
  aom_usec_timer ref_timer;
  int16_t dst_ref [1024];
  int16_t dst [1024];
  aom_usec_timer aStack_1068;
  aom_usec_timer local_1048;
  int16_t local_1028 [1024];
  int16_t local_828 [1024];
  
  CFLTestWithData<unsigned_short>::randData
            (&(this->super_CFLSubAvgTest).super_CFLTestWithData<unsigned_short>,0x448130);
  ::aom_usec_timer_start(&local_1048);
  iVar3 = 0x7fff;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    (*(this->super_CFLSubAvgTest).sub_avg_ref)
              ((this->super_CFLSubAvgTest).super_CFLTestWithData<unsigned_short>.data_ref,local_1028
              );
  }
  ::aom_usec_timer_mark(&local_1048);
  iVar1 = ::aom_usec_timer_elapsed(&local_1048);
  ::aom_usec_timer_start(&aStack_1068);
  iVar3 = 0x7fff;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    (*(this->super_CFLSubAvgTest).sub_avg)
              ((this->super_CFLSubAvgTest).super_CFLTestWithData<unsigned_short>.data,local_828);
  }
  ::aom_usec_timer_mark(&aStack_1068);
  iVar2 = ::aom_usec_timer_elapsed(&aStack_1068);
  printSpeed((int)iVar1,(int)iVar2,
             (this->super_CFLSubAvgTest).super_CFLTestWithData<unsigned_short>.super_CFLTest.width,
             (this->super_CFLSubAvgTest).super_CFLTestWithData<unsigned_short>.super_CFLTest.height)
  ;
  assertFaster((int)iVar1,(int)iVar2);
  return;
}

Assistant:

TEST_P(CFLSubAvgTest, DISABLED_SubAvgSpeedTest) {
  int16_t dst[CFL_BUF_SQUARE];
  int16_t dst_ref[CFL_BUF_SQUARE];
  aom_usec_timer ref_timer;
  aom_usec_timer timer;
  randData(&ACMRandom::Rand15);
  aom_usec_timer_start(&ref_timer);
  for (int k = 0; k < NUM_ITERATIONS_SPEED; k++) {
    sub_avg_ref(data_ref, dst_ref);
  }
  aom_usec_timer_mark(&ref_timer);
  int ref_elapsed_time = (int)aom_usec_timer_elapsed(&ref_timer);
  aom_usec_timer_start(&timer);
  for (int k = 0; k < NUM_ITERATIONS_SPEED; k++) {
    sub_avg(data, dst);
  }
  aom_usec_timer_mark(&timer);
  int elapsed_time = (int)aom_usec_timer_elapsed(&timer);
  printSpeed(ref_elapsed_time, elapsed_time, width, height);
  assertFaster(ref_elapsed_time, elapsed_time);
}